

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Resim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int RetValue;
  int c;
  Cec_ParSim_t *pPars;
  Cec_ParSim_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._40_8_ = argv;
  Cec_ManSimSetDefaultParams((Cec_ParSim_t *)&pPars);
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,(char **)Pars._40_8_,"Fmvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Resim(): There is no AIG.\n");
          return 1;
        }
        iVar2 = Cec_ManSeqResimulateCounter(pAbc->pGia,(Cec_ParSim_t *)&pPars,pAbc->pCex);
        iVar1 = -1;
        if (iVar2 != 0) {
          iVar1 = 0;
        }
        pAbc->Status = iVar1;
        pAbc->nFrames = pAbc->pCex->iFrame;
        return 0;
      }
      if (iVar1 == 0x46) break;
      if (iVar1 == 0x68) goto LAB_0025d366;
      if (iVar1 == 0x6d) {
        Pars.TimeLimit = Pars.TimeLimit ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0025d366;
        Pars.fConstCorr = Pars.fConstCorr ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    pPars._4_4_ = atoi(*(char **)(Pars._40_8_ + (long)globalUtilOptind * 8));
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)pPars._4_4_ < 0) {
LAB_0025d366:
      Abc_Print(-2,"usage: &resim [-F num] [-mvh]\n");
      Abc_Print(-2,"\t         resimulates equivalence classes using counter-example\n");
      Abc_Print(-2,"\t-F num : the number of additinal frames to simulate [default = %d]\n",
                (ulong)pPars._4_4_);
      pcVar3 = "circuit";
      if (Pars.TimeLimit != 0) {
        pcVar3 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fConstCorr != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_0025d366;
}

Assistant:

int Abc_CommandAbc9Resim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSim_t Pars, * pPars = &Pars;
    int c, RetValue;
    Cec_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    RetValue = Cec_ManSeqResimulateCounter( pAbc->pGia, pPars, pAbc->pCex );
    pAbc->Status  = RetValue ? 0 : -1;
    pAbc->nFrames = pAbc->pCex->iFrame;
//    Abc_FrameReplaceCex( pAbc, &pAbc->pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: &resim [-F num] [-mvh]\n" );
    Abc_Print( -2, "\t         resimulates equivalence classes using counter-example\n" );
    Abc_Print( -2, "\t-F num : the number of additinal frames to simulate [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}